

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O3

Token __thiscall
slang::parsing::NumberParser::finishValue(NumberParser *this,Token firstToken,bool singleToken)

{
  ulong uVar1;
  byte bVar2;
  size_type sVar3;
  SourceLocation location;
  BumpAllocator *pBVar4;
  long lVar5;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *this_00;
  undefined4 extraout_var_01;
  logic_error *this_01;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  uint uVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  bitwidth_t bVar13;
  size_type in_R9;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar14;
  Token TVar15;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  SVInt result;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_110;
  uint local_108;
  undefined1 local_104;
  byte bStack_103;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f0;
  Info *local_e8;
  long local_e0;
  long lStack_d8;
  Token local_d0;
  string_view local_c0;
  long local_b0;
  long lStack_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pointer local_60;
  size_type sStack_58;
  string local_50;
  
  local_d0.info = firstToken.info;
  local_d0._0_8_ = firstToken._0_8_;
  if (this->valid == false) {
    pBVar4 = this->alloc;
    sVar14 = Token::trivia(&local_d0);
    if (singleToken) {
      local_c0 = Token::rawText(&local_d0);
    }
    else {
      iVar8 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar14.size_);
      local_c0._M_str._4_4_ = extraout_var;
      local_c0._M_str._0_4_ = iVar8;
      local_c0._M_len = extraout_RDX;
    }
    location = this->firstLocation;
    bStack_103 = 0;
    local_110.val._0_6_ = 0;
    local_110.val._6_2_ = 0;
    local_104 = 1;
    local_108 = 1;
    SVInt::clearUnusedBits((SVInt *)&local_110);
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar14,local_c0,location,
                 (SVInt *)&local_110);
    if (((0x40 < local_108) || ((bStack_103 & 1) != 0)) &&
       ((void *)CONCAT26(local_110.val._6_2_,local_110.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(local_110.val._6_2_,local_110.val._0_6_));
    }
    goto LAB_0032ba24;
  }
  if ((this->literalBase == Decimal) && (this->hasUnknown == false)) {
    uVar7 = (this->decimalValue).super_SVIntStorage.bitWidth;
    local_110.val._0_6_ = 0;
    local_110.val._6_2_ = 0;
    local_108 = 1;
    local_104 = 0;
    bStack_103 = 0;
    uVar12 = this->sizeBits;
    bVar13 = (bitwidth_t)&this->decimalValue;
    if (uVar12 == 0) {
      if (uVar7 < 0x20) {
        SVInt::resize((SVInt *)&local_f0,bVar13);
        goto LAB_0032b845;
      }
LAB_0032b876:
      SVInt::operator=((SVInt *)&local_110,&this->decimalValue);
    }
    else {
      if (uVar7 == uVar12) goto LAB_0032b876;
      if (uVar12 < uVar7) {
        Diagnostics::add(this->diagnostics,(DiagCode)0xb0003,this->firstLocation);
      }
      SVInt::resize((SVInt *)&local_f0,bVar13);
LAB_0032b845:
      SVInt::operator=((SVInt *)&local_110,(SVInt *)&local_f0);
      if (((0x40 < (uint)local_e8) || (((ulong)local_e8 & 0x10000000000) != 0)) &&
         ((void *)local_f0.val != (void *)0x0)) {
        operator_delete__(local_f0.pVal);
      }
    }
    local_104 = this->signFlag;
    pBVar4 = this->alloc;
    sVar14 = Token::trivia(&local_d0);
    if (singleToken) {
      local_c0 = Token::rawText(&local_d0);
    }
    else {
      iVar8 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar14.size_);
      local_c0._M_str._4_4_ = extraout_var_00;
      local_c0._M_str._0_4_ = iVar8;
      local_c0._M_len = extraout_RDX_00;
    }
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar14,local_c0,this->firstLocation,
                 (SVInt *)&local_110);
  }
  else {
    sVar3 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    if (sVar3 == 0) {
      local_f0.val = local_f0.val & 0xffffffffffffff00;
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
                (&(this->digits).super_SmallVectorBase<slang::logic_t>,(logic_t *)&local_f0);
    }
    else {
      switch(this->literalBase) {
      case Binary:
        iVar8 = 1;
        break;
      case Octal:
        iVar8 = 3;
        break;
      case Decimal:
        goto switchD_0032b671_caseD_2;
      case Hex:
        iVar8 = 4;
        break;
      default:
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/NumberParser.cpp"
                   ,"");
        plVar9 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_80._M_dataplus._M_p = (pointer)*plVar9;
        psVar10 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_80._M_dataplus._M_p == psVar10) {
          local_80.field_2._M_allocated_capacity = *psVar10;
          local_80.field_2._8_8_ = plVar9[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar10;
        }
        local_80._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::to_string(&local_50,0xe5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_110,&local_80,&local_50);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_110.val);
        local_c0._M_len = *plVar9;
        plVar11 = plVar9 + 2;
        if ((long *)local_c0._M_len == plVar11) {
          local_b0 = *plVar11;
          lStack_a8 = plVar9[3];
          local_c0._M_len = (size_t)&local_b0;
        }
        else {
          local_b0 = *plVar11;
        }
        local_c0._M_str = (char *)plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_f0.pVal = (uint64_t *)*plVar9;
        plVar11 = plVar9 + 2;
        if ((long *)local_f0.val == plVar11) {
          local_e0 = *plVar11;
          lStack_d8 = plVar9[3];
          local_f0.pVal = (uint64_t *)&local_e0;
        }
        else {
          local_e0 = *plVar11;
        }
        local_e8 = (Info *)plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::logic_error::logic_error(this_01,(string *)&local_f0);
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar7 = ((int)sVar3 + -1) * iVar8;
      bVar2 = ((this->digits).super_SmallVectorBase<slang::logic_t>.data_)->value;
      if ((bVar2 != 0x80) && (bVar2 != 0x40)) {
        uVar1 = (ulong)bVar2 + 1;
        lVar5 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar12 = 0x40 - ((uint)lVar5 ^ 0x3f);
        if ((-1L << ((byte)lVar5 & 0x3f) ^ (ulong)bVar2) == 0xffffffffffffffff) {
          uVar12 = (uint)lVar5;
        }
        uVar7 = uVar12 + uVar7;
      }
      if (this->sizeBits < uVar7) {
        if (this->sizeBits == 0) {
          if (uVar7 < 0x1000000) {
            uVar12 = 0x20;
            if (0x20 < uVar7) {
              uVar12 = uVar7;
            }
          }
          else {
            this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0x20003,this->firstLocation);
            local_f0.val = 0xffffff;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
            ::emplace_back<long>(&this_00->args,(long *)&local_f0.val);
            uVar12 = 0xffffff;
          }
          this->sizeBits = uVar12;
        }
        else {
          Diagnostics::add(this->diagnostics,(DiagCode)0xb0003,this->firstLocation);
        }
      }
    }
switchD_0032b671_caseD_2:
    bVar13 = 0x20;
    if (this->sizeBits != 0) {
      bVar13 = this->sizeBits;
    }
    digits.data_ = (pointer)(ulong)this->hasUnknown;
    local_60 = (this->digits).super_SmallVectorBase<slang::logic_t>.data_;
    sStack_58 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    digits.size_ = in_R9;
    SVInt::fromDigits((bitwidth_t)&local_110,(LiteralBase)bVar13,(bool)this->literalBase,
                      this->signFlag,digits);
    pBVar4 = this->alloc;
    sVar14 = Token::trivia(&local_d0);
    if (singleToken) {
      local_c0 = Token::rawText(&local_d0);
    }
    else {
      iVar8 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar14.size_);
      local_c0._M_str._4_4_ = extraout_var_01;
      local_c0._M_str._0_4_ = iVar8;
      local_c0._M_len = extraout_RDX_01;
    }
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar14,local_c0,this->firstLocation,
                 (SVInt *)&local_110);
  }
  aVar6 = local_f0;
  if (((0x40 < local_108) || (local_f0 = aVar6, (bStack_103 & 1) != 0)) &&
     (local_f0 = aVar6, (void *)CONCAT26(local_110.val._6_2_,local_110.val._0_6_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT26(local_110.val._6_2_,local_110.val._0_6_));
    local_f0 = aVar6;
  }
LAB_0032ba24:
  TVar15.info = local_e8;
  TVar15.kind = local_f0._0_2_;
  TVar15._2_1_ = local_f0._2_1_;
  TVar15.numFlags.raw = local_f0._3_1_;
  TVar15.rawLen = local_f0._4_4_;
  return TVar15;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal) {
        // If we added an x or z, fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        if (!hasUnknown) {
            // If no size was specified, just return the value as-is. Otherwise,
            // resize it to match the desired size. Warn if that will truncate.
            bitwidth_t width = decimalValue.getBitWidth();
            SVInt result;
            if (!sizeBits) {
                // Unsized numbers are required to be at least 32 bits by the spec.
                if (width < 32)
                    result = decimalValue.resize(32);
                else
                    result = std::move(decimalValue);
            }
            else if (width != sizeBits) {
                if (width > sizeBits)
                    addDiag(diag::VectorLiteralOverflow, firstLocation);

                result = decimalValue.resize(sizeBits);
            }
            else {
                result = std::move(decimalValue);
            }

            result.setSigned(signFlag);
            return createResult(result);
        }
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += clog2(digits[0].value + 1);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                // We should warn about overflow here, but the spec says it is valid and
                // the literal gets truncated. Definitely a warning though.
                addDiag(diag::VectorLiteralOverflow, firstLocation);
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}